

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_nls.c
# Opt level: O1

int mriStep_NlsConvTest(SUNNonlinearSolver NLS,N_Vector y,N_Vector del,sunrealtype tol,N_Vector ewt,
                       void *arkode_mem)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  ARKodeMRIStepMem step_mem;
  int m;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem local_40;
  int local_34;
  double local_30;
  sunrealtype local_28;
  ARKodeMem local_20;
  
  local_28 = tol;
  iVar1 = mriStep_AccessARKODEStepMem(arkode_mem,"mriStep_NlsConvTest",&local_20,&local_40);
  if (iVar1 == 0) {
    iVar1 = 0;
    if (local_40->linear == 0) {
      local_30 = (double)N_VWrmsNorm(del,ewt);
      iVar2 = SUNNonlinSolGetCurIter(NLS,&local_34);
      iVar1 = -0x15;
      if (iVar2 == 0) {
        if (0 < local_34) {
          dVar3 = local_40->crdown * local_40->crate;
          dVar4 = local_30 / local_40->delp;
          if (dVar3 <= dVar4) {
            dVar3 = dVar4;
          }
          local_40->crate = dVar3;
        }
        dVar3 = local_40->crate;
        if (1.0 <= dVar3) {
          dVar3 = 1.0;
        }
        iVar1 = 0;
        if ((1.0 < (dVar3 * local_30) / local_28) &&
           ((local_34 < 1 || (iVar1 = 0x386, local_30 <= local_40->rdiv * local_40->delp)))) {
          local_40->delp = local_30;
          iVar1 = 0x385;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int mriStep_NlsConvTest(SUNNonlinearSolver NLS,
                        SUNDIALS_MAYBE_UNUSED N_Vector y, N_Vector del,
                        sunrealtype tol, N_Vector ewt, void* arkode_mem)
{
  /* temporary variables */
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  sunrealtype delnrm, dcon;
  int m, retval;

  /* access ARKodeMem and ARKodeMRIStepMem structures */
  retval = mriStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* if the problem is linearly implicit, just return success */
  if (step_mem->linear) { return (SUN_SUCCESS); }

  /* compute the norm of the correction */
  delnrm = N_VWrmsNorm(del, ewt);

  /* get the current nonlinear solver iteration count */
  retval = SUNNonlinSolGetCurIter(NLS, &m);
  if (retval != ARK_SUCCESS) { return (ARK_MEM_NULL); }

  /* update the stored estimate of the convergence rate (assumes linear convergence) */
  if (m > 0)
  {
    step_mem->crate = SUNMAX(step_mem->crdown * step_mem->crate,
                             delnrm / step_mem->delp);
  }

  /* compute our scaled error norm for testing convergence */
  dcon = SUNMIN(step_mem->crate, ONE) * delnrm / tol;

  /* check for convergence; if so return with success */
  if (dcon <= ONE) { return (SUN_SUCCESS); }

  /* check for divergence */
  if ((m >= 1) && (delnrm > step_mem->rdiv * step_mem->delp))
  {
    return (SUN_NLS_CONV_RECVR);
  }

  /* save norm of correction for next iteration */
  step_mem->delp = delnrm;

  /* return with flag that there is more work to do */
  return (SUN_NLS_CONTINUE);
}